

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsenumber.cpp
# Opt level: O1

int ICM::Parser::convertChar(char c)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,c);
  uVar3 = iVar1 - 0x30;
  if ((9 < uVar3) && (iVar2 = isalpha(iVar1), iVar2 == 0)) {
    __assert_fail("isdigit(c) || isalpha(c)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/source/parser/parsenumber.cpp"
                  ,0x1e,"int ICM::Parser::convertChar(char)");
  }
  if (9 < (byte)(c - 0x30U)) {
    if ((byte)(c + 0xbfU) < 0x1a) {
      uVar3 = iVar1 - 0x37;
    }
    else {
      uVar3 = iVar1 - 0x57;
    }
  }
  return uVar3;
}

Assistant:

static int convertChar(char c)
		{
			assert(isdigit(c) || isalpha(c));

			if (c >= '0' && c <= '9')
				return c - '0';
			else if (c >= 'A' && c <= 'Z')
				return c - 'A' + 10;
			else
				return c - 'a' + 10;
		}